

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  uint64_t uVar4;
  int __fd_00;
  undefined4 in_register_00000034;
  uv_buf_t buf;
  
  __fd_00 = (int)&buf;
  iVar2 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])();
  if ((char)iVar2 == '\0') {
    if ((this->super_BaseClient).m_state != ConnectedState) {
      return -1;
    }
    iVar2 = uv_is_writable(this->m_stream);
    if (iVar2 == 0) {
      return -1;
    }
    buf = (uv_buf_t)uv_buf_init(this->m_sendBuf,__fd);
    iVar2 = uv_try_write(this->m_stream,&buf,1);
    if (iVar2 < 0) {
      close(this,__fd_00);
      return -1;
    }
  }
  else {
    sVar3 = Tls::send(this->m_tls,(int)this + 0x280,(void *)CONCAT44(in_register_00000034,__fd),__n,
                      __flags);
    if ((char)sVar3 == '\0') {
      return -1;
    }
  }
  uVar4 = Chrono::steadyMSecs();
  this->m_expire = uVar4 + 20000;
  lVar1 = BaseClient::m_sequence;
  BaseClient::m_sequence = BaseClient::m_sequence + 1;
  return lVar1;
}

Assistant:

int64_t xmrig::Client::send(size_t size)
{
    LOG_DEBUG("[%s] send (%d bytes): \"%.*s\"", url(), size, static_cast<int>(size) - 1, m_sendBuf);

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        if (!m_tls->send(m_sendBuf, size)) {
            return -1;
        }
    }
    else
#   endif
    {
        if (state() != ConnectedState || !uv_is_writable(m_stream)) {
            LOG_DEBUG_ERR("[%s] send failed, invalid state: %d", url(), m_state);
            return -1;
        }

        uv_buf_t buf = uv_buf_init(m_sendBuf, (unsigned int) size);

        if (uv_try_write(m_stream, &buf, 1) < 0) {
            close();
            return -1;
        }
    }

    m_expire = Chrono::steadyMSecs() + kResponseTimeout;
    return m_sequence++;
}